

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  long *plVar1;
  size_t *psVar2;
  __uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_> _Var3;
  long lVar4;
  U *g;
  void *pvVar5;
  bool bVar6;
  undefined4 uVar7;
  int iVar8;
  U UVar9;
  long lVar10;
  ulong uVar11;
  U UVar12;
  long lVar13;
  atomic<unsigned_long> *paVar14;
  U *pUVar15;
  _Hash_node_base *p_Var16;
  U *pUVar17;
  SmallVector<tf::Node_*,_2U> nodes;
  SmallVector<int,_2U> conds;
  U local_a8;
  U local_a0;
  U local_98;
  U local_90;
  char local_88;
  pthread_mutex_t *local_80;
  U local_78;
  SmallVectorImpl<int> local_70;
  pthread_mutex_t *local_50;
  TaskQueue<tf::Node_*> *local_48;
  Notifier *local_40;
  TaskQueue<tf::Node_*> *local_38;
  
  do {
  } while (((node->_state).super___atomic_base<int>._M_i & 8U) == 0);
  local_50 = (pthread_mutex_t *)&this->_topology_mutex;
  local_80 = (pthread_mutex_t *)&this->_wsq_mutex;
  local_38 = &this->_wsq;
  local_40 = &this->_notifier;
  local_48 = &worker->_wsq;
  local_78 = (U)worker;
  do {
    pUVar17 = &local_70.super_SmallVectorTemplateBase<int,_true>.
               super_SmallVectorTemplateCommon<int,_void>.FirstEl;
    if ((((((U *)((long)node + 0x68))->__data[0] == '\x06') &&
         (*(byte **)((U *)((long)node + 0x50))->__data != (byte *)0x0)) &&
        ((**(byte **)((U *)((long)node + 0x50))->__data & 1) != 0)) ||
       ((*(U *)((long)node + 0xc0) != (U)0x0 && ((*(byte *)*(U *)((long)node + 0xc0) & 1) != 0)))) {
      _cancel_invoke(this,worker,node);
      return;
    }
    _Var3._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
         *(tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_> *)
          ((U *)((long)node + 0xe0))->__data;
    if (((__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)
         _Var3._M_t.
         super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
         super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)0x0) &&
       (*(long *)_Var3._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
        *(long *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                        .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 8))) {
      local_a8 = (U)&local_90;
      local_98 = (U)&local_80;
      local_a0 = local_a8;
      bVar6 = Node::_acquire_all(node,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      if (bVar6) {
        LOCK();
        *(uint *)((long)node + 0xd0) =
             ((__int_type_conflict2)*(__atomic_base<int> *)((long)node + 0xd0))._M_i | 4;
        UNLOCK();
      }
      else {
        _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      }
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
      if (!bVar6) {
        return;
      }
    }
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.CapacityX = &local_50;
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.BeginX = pUVar17;
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = pUVar17;
    if (9 < ((U *)((long)node + 0x68))->__data[0] - 1) goto LAB_0015124b;
    pUVar15 = (U *)((long)node + 0x30);
    switch((uint)((U *)((long)node + 0x68))->__data[0]) {
    case 1:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\x01') {
        pUVar15 = (U *)0x0;
      }
      if (pUVar15[2] == (U)0x0) {
LAB_0015158f:
        std::__throw_bad_function_call();
      }
      (*(code *)pUVar15[3])(pUVar15);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 2:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\x02') {
        pUVar15 = (U *)0x0;
      }
      UVar12 = pUVar15[5];
      for (UVar9 = *(U *)pUVar15[4].__data; worker = (Worker *)local_78, UVar9 != UVar12;
          UVar9.__data = UVar9.__data + 8) {
        ObjectPool<tf::Node,_65536UL>::recycle
                  ((ObjectPool<tf::Node,_65536UL> *)node_pool,*(Node **)UVar9);
      }
      if (pUVar15[5] != pUVar15[4]) {
        pUVar15[5] = pUVar15[4];
      }
      g = pUVar15 + 4;
      local_98 = local_78;
      local_88 = '\x01';
      local_a8 = (U)g;
      local_a0 = (U)this;
      local_90 = (U)node;
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      (*(code *)pUVar15[3])(pUVar15);
      if (local_88 == '\x01') {
        _join_dynamic_task_internal(this,worker,node,(Graph *)&g->__align);
      }
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 3:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\x03') {
        pUVar15 = (U *)0x0;
      }
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      uVar7 = (*(code *)pUVar15[3])(pUVar15);
      local_a8._0_4_ = uVar7;
      local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.EndX =
           local_70.super_SmallVectorTemplateBase<int,_true>.
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
      SmallVectorImpl<int>::append<int_const*>
                (&local_70,(int *)local_a8.__data,(int *)(local_a8.__data + 4));
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 4:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\x04') {
        pUVar15 = (U *)0x0;
      }
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      (*(code *)pUVar15[3])(&local_a8,pUVar15);
      SmallVectorImpl<int>::operator=(&local_70,(SmallVectorImpl<int> *)&local_a8.__align);
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 5:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      _join_dynamic_task_internal(this,worker,node,(Graph *)*(U *)((long)node + 0x30));
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 6:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\x06') {
        pUVar15 = (U *)0x0;
      }
      local_a8.__data = local_a8.__data & 0xffffffffffffff00;
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      (*(code *)pUVar15[3])(pUVar15,&local_a8);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      goto LAB_0015114a;
    case 7:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\a') {
        pUVar15 = (U *)0x0;
      }
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      (*(code *)pUVar15[3])(pUVar15);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
LAB_0015114a:
      if (*(U *)((long)node + 200) == (U)0x0) {
        iVar8 = pthread_mutex_lock(local_50);
        if (iVar8 != 0) {
          std::__throw_system_error(iVar8);
        }
        psVar2 = &this->_num_topologies;
        *psVar2 = *psVar2 - 1;
        if (*psVar2 == 0) {
          std::condition_variable::notify_all();
        }
        pthread_mutex_unlock(local_50);
      }
      else {
        LOCK();
        paVar14 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
        (paVar14->super___atomic_base<unsigned_long>)._M_i =
             (paVar14->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
      }
      bVar6 = true;
      ObjectPool<tf::Node,_65536UL>::recycle((ObjectPool<tf::Node,_65536UL> *)node_pool,node);
      goto LAB_00151501;
    case 8:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\b') {
        pUVar15 = (U *)0x0;
      }
      local_a8 = (U)node;
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      local_a8 = (U)node;
      (*(code *)pUVar15[3])(pUVar15,this,&local_a8);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 9:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\t') {
        pUVar15 = (U *)0x0;
      }
      local_a8 = (U)node;
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      local_a8 = (U)node;
      (*(code *)pUVar15[3])(pUVar15,this,&local_a8);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 10:
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      if (((U *)((long)node + 0x68))->__data[0] != '\n') {
        pUVar15 = (U *)0x0;
      }
      local_a8 = (U)this;
      local_a0 = (U)worker;
      local_98 = (U)node;
      if (pUVar15[2] == (U)0x0) goto LAB_0015158f;
      local_a8 = (U)this;
      (*(code *)pUVar15[3])(pUVar15);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
    }
LAB_0015124b:
    _Var3._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
         *(tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_> *)
          ((U *)((long)node + 0xe0))->__data;
    if (((__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)
         _Var3._M_t.
         super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
         super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)0x0) &&
       (*(long *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                        .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 0x28)
        != *(long *)((long)_Var3._M_t.
                           super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                           .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 0x30
                    ))) {
      Node::_release_all((SmallVector<tf::Node_*,_2U> *)&local_a8.__align,node);
      _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
    }
    pvVar5 = local_70.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
    lVar4 = *(long *)((U *)((long)node + 0x98))->__data;
    if ((((__int_type_conflict2)*(__atomic_base<int> *)((long)node + 0xd0))._M_i & 1U) == 0) {
      UVar9 = (U)((long)*(U *)((long)node + 0xa0) - lVar4 >> 3);
    }
    else {
      lVar10 = (long)*(U *)((long)node + 0xa0) - lVar4;
      if (lVar10 == 0) {
        UVar9 = (U)0x0;
      }
      else {
        lVar10 = lVar10 >> 3;
        lVar13 = 0;
        UVar9 = (U)0x0;
        do {
          UVar9.__data = UVar9.__data +
                         (ulong)((byte)(*(char *)(*(long *)(lVar4 + lVar13 * 8) + 0x68) - 5U) < 0xfe
                                );
          lVar13 = lVar13 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
      }
    }
    LOCK();
    *(U *)((long)node + 0xd8) = UVar9;
    UNLOCK();
    if (*(U *)((long)node + 200) == (U)0x0) {
      paVar14 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 0xc0) + 0x90);
    }
    else {
      paVar14 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
    }
    if ((long)(char)((U *)((long)node + 0x68))->__data[0] - 3U < 2) {
      if (local_70.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX ==
          local_70.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX) {
LAB_001514a5:
        UVar12 = (U)0x0;
      }
      else {
        UVar9 = (U)0x0;
        pUVar17 = (U *)local_70.super_SmallVectorTemplateBase<int,_true>.
                       super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
        do {
          uVar11 = (ulong)(int)*pUVar17;
          UVar12 = UVar9;
          if ((-1 < (long)uVar11) &&
             (uVar11 < (ulong)((long)*(U *)((long)node + 0x78) -
                               *(long *)((U *)((long)node + 0x70))->__data >> 3))) {
            UVar12 = *(U *)((U *)(*(long *)((U *)((long)node + 0x70))->__data + uVar11 * 8))->__data
            ;
            *(U *)((long)UVar12 + 0xd8) = (U)0x0;
            LOCK();
            (paVar14->super___atomic_base<unsigned_long>)._M_i =
                 (paVar14->super___atomic_base<unsigned_long>)._M_i + 1;
            UNLOCK();
            if (UVar9 != (U)0x0) {
              LOCK();
              *(uint *)((long)UVar9 + 0xd0) = *(uint *)((long)UVar9 + 0xd0) | 8;
              UNLOCK();
              if (*(U *)((long)local_78 + 0x10) == (U)this) {
                TaskQueue<tf::Node_*>::push(local_48,(Node *)UVar9);
              }
              else {
                iVar8 = pthread_mutex_lock(local_80);
                if (iVar8 != 0) {
                  std::__throw_system_error(iVar8);
                }
                TaskQueue<tf::Node_*>::push(local_38,(Node *)UVar9);
                pthread_mutex_unlock(local_80);
                Notifier::notify(local_40,false);
              }
            }
          }
          pUVar17 = pUVar17 + 1;
          UVar9 = UVar12;
        } while (pUVar17 != (U *)pvVar5);
      }
    }
    else {
      UVar9 = *(U *)((long)node + 0x70);
      if (*(U *)((long)node + 0x78) == UVar9) goto LAB_001514a5;
      uVar11 = 0;
      UVar12 = (U)0x0;
      do {
        LOCK();
        plVar1 = (long *)(*(long *)((long)UVar9 + uVar11 * 8) + 0xd8);
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (*plVar1 == 0) {
          LOCK();
          (paVar14->super___atomic_base<unsigned_long>)._M_i =
               (paVar14->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          if (UVar12 != (U)0x0) {
            LOCK();
            *(uint *)((long)UVar12 + 0xd0) = *(uint *)((long)UVar12 + 0xd0) | 8;
            UNLOCK();
            if (*(U *)((long)local_78 + 0x10) == (U)this) {
              TaskQueue<tf::Node_*>::push(local_48,(Node *)UVar12);
            }
            else {
              iVar8 = pthread_mutex_lock(local_80);
              if (iVar8 != 0) {
                std::__throw_system_error(iVar8);
              }
              TaskQueue<tf::Node_*>::push(local_38,(Node *)UVar12);
              pthread_mutex_unlock(local_80);
              Notifier::notify(local_40,false);
            }
          }
          UVar12 = *(U *)((U *)((long)*(U *)((long)node + 0x70) + uVar11 * 8))->__data;
        }
        uVar11 = uVar11 + 1;
        UVar9 = *(U *)((U *)((long)node + 0x70))->__data;
      } while (uVar11 < (ulong)((long)*(U *)((long)node + 0x78) - (long)UVar9 >> 3));
    }
    worker = (Worker *)local_78;
    if (*(U *)((long)node + 200) == (U)0x0) {
      LOCK();
      paVar14 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 0xc0) + 0x90);
      (paVar14->super___atomic_base<unsigned_long>)._M_i =
           (paVar14->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar14->super___atomic_base<unsigned_long>)._M_i == 0) {
        _tear_down_topology(this,(Worker *)local_78,(Topology *)*(U *)((long)node + 0xc0));
      }
    }
    else {
      LOCK();
      paVar14 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
      (paVar14->super___atomic_base<unsigned_long>)._M_i =
           (paVar14->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
    }
    bVar6 = UVar12 == (U)0x0;
    if (!bVar6) {
      node = (Node *)UVar12;
    }
LAB_00151501:
    if ((U *)local_70.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX !=
        &local_70.super_SmallVectorTemplateBase<int,_true>.
         super_SmallVectorTemplateCommon<int,_void>.FirstEl) {
      free(local_70.super_SmallVectorTemplateBase<int,_true>.
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
    }
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  // synchronize all outstanding memory operations caused by reordering
  while(!(node->_state.load(std::memory_order_acquire) & Node::READY));

  begin_invoke:

  // no need to do other things if the topology is cancelled
  if(node->_is_cancelled()) {
    _cancel_invoke(worker, node);
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> nodes;
    if(!node->_acquire_all(nodes)) {
      _schedule(worker, nodes);
      return;
    }
    node->_state.fetch_or(Node::ACQUIRED, std::memory_order_release);
  }

  // condition task
  //int cond = -1;
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;

    // dynamic task
    case Node::DYNAMIC: {
      _invoke_dynamic_task(worker, node);
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      _invoke_module_task(worker, node);
    }
    break;

    // async task
    case Node::ASYNC: {
      _invoke_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // silent async task
    case Node::SILENT_ASYNC: {
      _invoke_silent_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // cudaflow task
    case Node::CUDAFLOW: {
      _invoke_cudaflow_task(worker, node);
    }
    break;

    // syclflow task
    case Node::SYCLFLOW: {
      _invoke_syclflow_task(worker, node);
    }
    break;

    // runtime task
    case Node::RUNTIME: {
      _invoke_runtime_task(worker, node);
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    _schedule(worker, node->_release_all());
  }

  // We MUST recover the dependency since the graph may have cycles.
  // This must be done before scheduling the successors, otherwise this might cause
  // race condition on the _dependents
  if((node->_state.load(std::memory_order_relaxed) & Node::CONDITIONED)) {
    node->_join_counter = node->num_strong_dependents();
  }
  else {
    node->_join_counter = node->num_dependents();
  }

  // acquire the parent flow counter
  auto& j = (node->_parent) ? node->_parent->_join_counter :
                              node->_topology->_join_counter;

  Node* cache {nullptr};

  // At this point, the node storage might be destructed (to be verified)
  // case 1: non-condition task
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_successors.size()) {
          auto s = node->_successors[cond];
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = s;
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_successors.size(); ++i) {
        if(--(node->_successors[i]->_join_counter) == 0) {
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = node->_successors[i];
        }
      }
    }
    break;
  }

  // tear_down the invoke
  _tear_down_invoke(worker, node);

  // perform tail recursion elimination for the right-most child to reduce
  // the number of expensive pop/push operations through the task queue
  if(cache) {
    node = cache;
    //node->_state.fetch_or(Node::READY, std::memory_order_release);
    goto begin_invoke;
  }
}